

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O3

DdNode * cuddBddCharToVect(DdManager *dd,DdNode *f,DdNode *x)

{
  int *piVar1;
  uint uVar2;
  DdNode *pDVar3;
  uint uVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  
  pDVar5 = cuddCacheLookup2(dd,cuddBddCharToVect,f,x);
  while( true ) {
    if (pDVar5 != (DdNode *)0x0) {
      return pDVar5;
    }
    pDVar5 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
    uVar4 = 0x7fffffff;
    if ((ulong)pDVar5->index != 0x7fffffff) {
      uVar4 = dd->perm[pDVar5->index];
    }
    uVar2 = dd->perm[x->index];
    if (uVar2 < uVar4) {
      return x;
    }
    pDVar8 = (DdNode *)((ulong)dd->one ^ 1);
    pDVar7 = (DdNode *)((ulong)(pDVar5->type).kids.T ^ (ulong)(f != pDVar5));
    pDVar6 = (DdNode *)((ulong)(f != pDVar5) ^ (ulong)(pDVar5->type).kids.E);
    if (uVar4 == uVar2) break;
    pDVar3 = pDVar6;
    if ((pDVar7 != pDVar8) && (pDVar3 = pDVar7, pDVar6 != pDVar8)) {
      pDVar7 = cuddBddCharToVect(dd,pDVar7,x);
      if (pDVar7 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar6 = cuddBddCharToVect(dd,pDVar6,x);
        if (pDVar6 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar5 = cuddBddIteRecur(dd,dd->vars[pDVar5->index],pDVar7,pDVar6);
          if (pDVar5 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            cuddCacheInsert2(dd,cuddBddCharToVect,f,x,pDVar5);
            return pDVar5;
          }
          Cudd_IterDerefBdd(dd,pDVar7);
          pDVar7 = pDVar6;
        }
        Cudd_IterDerefBdd(dd,pDVar7);
      }
      return (DdNode *)0x0;
    }
    f = pDVar3;
    pDVar5 = cuddCacheLookup2(dd,cuddBddCharToVect,f,x);
  }
  if (pDVar7 == pDVar8) {
    return pDVar8;
  }
  if (pDVar6 != pDVar8) {
    return x;
  }
  return dd->one;
}

Assistant:

static DdNode *
cuddBddCharToVect(
  DdManager * dd,
  DdNode * f,
  DdNode * x)
{
    unsigned int topf;
    unsigned int level;
    int comple;

    DdNode *one, *zero, *res, *F, *fT, *fE, *T, *E;

    statLine(dd);
    /* Check the cache. */
    res = cuddCacheLookup2(dd, cuddBddCharToVect, f, x);
    if (res != NULL) {
        return(res);
    }

    F = Cudd_Regular(f);

    topf = cuddI(dd,F->index);
    level = dd->perm[x->index];

    if (topf > level) return(x);

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    comple = F != f;
    fT = Cudd_NotCond(cuddT(F),comple);
    fE = Cudd_NotCond(cuddE(F),comple);

    if (topf == level) {
        if (fT == zero) return(zero);
        if (fE == zero) return(one);
        return(x);
    }

    /* Here topf < level. */
    if (fT == zero) return(cuddBddCharToVect(dd, fE, x));
    if (fE == zero) return(cuddBddCharToVect(dd, fT, x));

    T = cuddBddCharToVect(dd, fT, x);
    if (T == NULL) {
        return(NULL);
    }
    cuddRef(T);
    E = cuddBddCharToVect(dd, fE, x);
    if (E == NULL) {
        Cudd_IterDerefBdd(dd,T);
        return(NULL);
    }
    cuddRef(E);
    res = cuddBddIteRecur(dd, dd->vars[F->index], T, E);
    if (res == NULL) {
        Cudd_IterDerefBdd(dd,T);
        Cudd_IterDerefBdd(dd,E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);
    cuddCacheInsert2(dd, cuddBddCharToVect, f, x, res);
    return(res);

}